

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::Statistics::Statistics(Statistics *this,ClaspFacade *f)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  SolverStats *in_stack_ffffffffffffffc0;
  StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3> *this_00;
  
  *in_RDI = in_RSI;
  SingleOwnerPtr<Clasp::Asp::LpStats,_Clasp::DeleteObject>::SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::Asp::LpStats,_Clasp::DeleteObject> *)(in_RDI + 1));
  SolverStats::SolverStats(in_stack_ffffffffffffffc0);
  this_00 = (StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3> *)(in_RDI + 10);
  StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>::StatsVec(this_00);
  StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>::StatsVec(this_00);
  in_RDI[0x10] = 0;
  *(undefined4 *)(in_RDI + 0x11) = 0;
  in_RDI[0x12] = 0;
  return;
}

Assistant:

Statistics(ClaspFacade& f) : self_(&f), tester_(0), level_(0), clingo_(0) {}